

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O2

double p2sc_round(double v,int d)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double i;
  double local_18;
  
  dVar3 = modf(v,&local_18);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar4 = log10(v);
    dVar4 = floor(dVar4);
    uVar1 = (uint)(14.0 - dVar4);
    uVar2 = uVar1 - d;
    if (uVar2 != 0 && d <= (int)uVar1) {
      if (uVar1 < 0x10) {
        dVar4 = *(double *)(ipow10_powers + (ulong)uVar1 * 8);
      }
      else {
        dVar4 = pow(10.0,(double)(int)uVar1);
      }
      dVar3 = round(dVar3 * dVar4);
      if (uVar2 < 0x10) {
        dVar4 = *(double *)(ipow10_powers + (ulong)uVar2 * 8);
      }
      else {
        dVar4 = pow(10.0,(double)(int)uVar2);
      }
      dVar3 = round(dVar3 / dVar4);
      if ((uint)d < 0x10) {
        dVar4 = *(double *)(ipow10_powers + (ulong)(uint)d * 8);
      }
      else {
        dVar4 = pow(10.0,(double)d);
      }
      v = local_18 + dVar3 / dVar4;
    }
  }
  return v;
}

Assistant:

double p2sc_round(double v, int d) {
    int p;
    double i, f = modf(v, &i);

    if (!f)
        return v;

    /* idea from http://wiki.php.net/rfc/rounding */
    p = 14 - floor(log10(v));
    if (d >= p)
        return v;

    f = round(f * ipow10(p));
    f = round(f / ipow10(p - d));

    return i + f / ipow10(d);
}